

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O0

QString * escapeDir(QString *dir)

{
  ulong uVar1;
  QString *in_RSI;
  QStringBuilder<const_QString_&,_char> *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char> QVar2;
  QStringBuilder<const_QString_&,_char> *this;
  QChar local_1a;
  QString *local_18;
  char local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QChar::QChar<char,_true>(&local_1a,'\\');
  uVar1 = QString::endsWith((QChar)(char16_t)in_RSI,(uint)(ushort)local_1a.ucs);
  if ((uVar1 & 1) == 0) {
    QString::QString((QString *)this,(QString *)in_RDI);
  }
  else {
    QVar2 = operator+(in_RSI,(char *)this);
    local_18 = QVar2.a;
    local_10 = QVar2.b;
    QStringBuilder::operator_cast_to_QString(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this;
  }
  __stack_chk_fail();
}

Assistant:

static QString escapeDir(const QString &dir)
{
    // When building on non-MSys MinGW, the path ends with a backslash, which
    // GNU make will interpret that as a line continuation. Doubling the backslash
    // avoids the problem, at the cost of the variable containing *both* backslashes.
    if (dir.endsWith('\\'))
        return dir + '\\';
    return dir;
}